

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void test_34(QPDF *pdf,char *arg2)

{
  int iVar1;
  ostream *poVar2;
  long *plVar3;
  string v_string;
  int extension_level;
  char *local_98;
  long local_90;
  char local_88;
  undefined7 uStack_87;
  long *local_78 [2];
  long local_68 [3];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  string local_48 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  undefined1 local_38 [12];
  undefined4 uStack_2c;
  long local_28 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"version: ",9);
  QPDF::getPDFVersion_abi_cxx11_();
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_98,local_90);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"extension level: ",0x11);
  iVar1 = QPDF::getExtensionLevel();
  plVar3 = (long *)std::ostream::operator<<((ostream *)poVar2,iVar1);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  poVar2 = (ostream *)std::ostream::flush();
  QPDF::getRoot();
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"/Extensions","");
  QPDFObjectHandle::getKey(local_48);
  QPDFObjectHandle::unparse_abi_cxx11_();
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)local_38._0_8_,CONCAT44(uStack_2c,local_38._8_4_));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((long *)local_38._0_8_ != local_28) {
    operator_delete((void *)local_38._0_8_,local_28[0] + 1);
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
  local_38 = QPDF::getVersionAsPDFVersion();
  local_90 = 0;
  local_88 = '\0';
  local_98 = &local_88;
  PDFVersion::getVersion((string *)local_38,(int *)&local_98);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"As PDFVersion: ",0xf);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_98,local_90);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"/",1);
  plVar3 = (long *)std::ostream::operator<<((ostream *)poVar2,(int)local_78[0]);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
  return;
}

Assistant:

static void
test_34(QPDF& pdf, char const* arg2)
{
    // Look at Extensions dictionary
    std::cout << "version: " << pdf.getPDFVersion() << std::endl
              << "extension level: " << pdf.getExtensionLevel() << std::endl
              << pdf.getRoot().getKey("/Extensions").unparse() << std::endl;
    auto v = pdf.getVersionAsPDFVersion();
    std::string v_string;
    int extension_level;
    v.getVersion(v_string, extension_level);
    std::cout << "As PDFVersion: " << v_string << "/" << extension_level << std::endl;
}